

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall tchecker::clockbounds::df_solver_t::clear(df_solver_t *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = 0;
  while( true ) {
    uVar2 = (ulong)uVar1;
    uVar3 = this->_dim;
    if (uVar3 <= uVar2) break;
    uVar4 = 0;
    while( true ) {
      uVar5 = (ulong)uVar4;
      if (uVar3 <= uVar5) break;
      this->_L[uVar3 * uVar2 + uVar5] = (db_t)0x7ffffffe;
      this->_U[this->_dim * uVar2 + uVar5] = (db_t)0x7ffffffe;
      uVar4 = uVar4 + 1;
      uVar3 = this->_dim;
    }
    this->_L[(uVar3 + 1) * uVar2] = (db_t)0x1;
    this->_U[(this->_dim + 1) * uVar2] = (db_t)0x1;
    uVar1 = uVar1 + 1;
  }
  this->_updated_L = false;
  this->_updated_U = false;
  return;
}

Assistant:

void df_solver_t::clear()
{
  // <inf everywhere except <=0 on diagonal
  for (tchecker::clock_id_t x = 0; x < _dim; ++x) {
    for (tchecker::clock_id_t y = 0; y < _dim; ++y) {
      _L[x * _dim + y] = tchecker::dbm::LT_INFINITY;
      _U[x * _dim + y] = tchecker::dbm::LT_INFINITY;
    }
    _L[x * _dim + x] = tchecker::dbm::LE_ZERO;
    _U[x * _dim + x] = tchecker::dbm::LE_ZERO;
  }

  _updated_L = false;
  _updated_U = false;
}